

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_sib_offset(TCGContext_conflict9 *s,int r,int rm,int index,int shift,intptr_t offset)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  bool bVar3;
  int *piVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  char cVar9;
  bool bVar10;
  
  bVar8 = (byte)r;
  if ((index & rm) < 0) {
    pbVar1 = s->code_ptr;
    lVar7 = ((rm + offset) - (long)pbVar1) + -4;
    iVar6 = (int)lVar7;
    if (iVar6 == lVar7) {
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (bVar8 & 7) << 3 | 5;
      piVar4 = (int *)s->code_ptr;
      *piVar4 = iVar6;
      goto LAB_00d1008a;
    }
    if ((int)offset != offset) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x2dc,(char *)0x0);
    }
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = (bVar8 & 7) << 3 | 4;
    ptVar2 = s->code_ptr;
    s->code_ptr = ptVar2 + 1;
    *ptVar2 = '%';
  }
  else {
    if (rm < 0) {
      rm = 5;
      bVar3 = true;
      cVar9 = '\0';
      bVar10 = false;
    }
    else {
      cVar9 = '\0';
      if ((rm & 7U) == 5 || offset != 0) {
        bVar10 = (char)(tcg_insn_unit)offset == offset;
        bVar3 = !bVar10;
        cVar9 = bVar3 * '@' + '@';
      }
      else {
        bVar10 = false;
        bVar3 = false;
      }
    }
    if (index < 0) {
      bVar5 = 0x20;
      if ((rm & 7U) == 4) goto LAB_00d0ffe7;
      bVar8 = cVar9 + (bVar8 & 7) * '\b' | (byte)(rm & 7U);
    }
    else {
      bVar5 = (byte)((index & 7U) << 3);
LAB_00d0ffe7:
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = cVar9 + (bVar8 & 7) * '\b' | 4;
      bVar8 = (byte)rm & 7 | (byte)(shift << 6) | bVar5;
    }
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = bVar8;
    if (bVar10) {
      ptVar2 = s->code_ptr;
      s->code_ptr = ptVar2 + 1;
      *ptVar2 = (tcg_insn_unit)offset;
      return;
    }
    if (!bVar3) {
      return;
    }
  }
  piVar4 = (int *)s->code_ptr;
  *piVar4 = (int)offset;
LAB_00d1008a:
  s->code_ptr = (tcg_insn_unit *)(piVar4 + 1);
  return;
}

Assistant:

static void tcg_out_sib_offset(TCGContext *s, int r, int rm, int index,
                               int shift, intptr_t offset)
{
    int mod, len;

    if (index < 0 && rm < 0) {
        if (TCG_TARGET_REG_BITS == 64) {
            /* Try for a rip-relative addressing mode.  This has replaced
               the 32-bit-mode absolute addressing encoding.  */
            intptr_t pc = (intptr_t)s->code_ptr + 5 + ~rm;
            intptr_t disp = offset - pc;
            if (disp == (int32_t)disp) {
                tcg_out8(s, (LOWREGMASK(r) << 3) | 5);
                tcg_out32(s, disp);
                return;
            }

            /* Try for an absolute address encoding.  This requires the
               use of the MODRM+SIB encoding and is therefore larger than
               rip-relative addressing.  */
            if (offset == (int32_t)offset) {
                tcg_out8(s, (LOWREGMASK(r) << 3) | 4);
                tcg_out8(s, (4 << 3) | 5);
                tcg_out32(s, offset);
                return;
            }

            /* ??? The memory isn't directly addressable.  */
            g_assert_not_reached();
        } else {
            /* Absolute address.  */
            tcg_out8(s, (r << 3) | 5);
            tcg_out32(s, offset);
            return;
        }
    }

    /* Find the length of the immediate addend.  Note that the encoding
       that would be used for (%ebp) indicates absolute addressing.  */
    if (rm < 0) {
        mod = 0, len = 4, rm = 5;
    } else if (offset == 0 && LOWREGMASK(rm) != TCG_REG_EBP) {
        mod = 0, len = 0;
    } else if (offset == (int8_t)offset) {
        mod = 0x40, len = 1;
    } else {
        mod = 0x80, len = 4;
    }

    /* Use a single byte MODRM format if possible.  Note that the encoding
       that would be used for %esp is the escape to the two byte form.  */
    if (index < 0 && LOWREGMASK(rm) != TCG_REG_ESP) {
        /* Single byte MODRM format.  */
        tcg_out8(s, mod | (LOWREGMASK(r) << 3) | LOWREGMASK(rm));
    } else {
        /* Two byte MODRM+SIB format.  */

        /* Note that the encoding that would place %esp into the index
           field indicates no index register.  In 64-bit mode, the REX.X
           bit counts, so %r12 can be used as the index.  */
        if (index < 0) {
            index = 4;
        } else {
            tcg_debug_assert(index != TCG_REG_ESP);
        }

        tcg_out8(s, mod | (LOWREGMASK(r) << 3) | 4);
        tcg_out8(s, (shift << 6) | (LOWREGMASK(index) << 3) | LOWREGMASK(rm));
    }

    if (len == 1) {
        tcg_out8(s, offset);
    } else if (len == 4) {
        tcg_out32(s, offset);
    }
}